

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_computeDivergence
               (MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom,
               bool already_on_centroids,MultiFab *vel_eb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  EBCellFlagFab *this;
  EBCellFlag *pEVar6;
  long lVar7;
  FabArray<amrex::EBCellFlagFab> *pFVar8;
  FabType FVar9;
  long lVar10;
  FabArray<amrex::EBCellFlagFab> *pFVar11;
  int *piVar12;
  uint32_t *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  MFIter mfi;
  MFItInfo info;
  long local_2d0;
  long local_2a0;
  Box local_294;
  FabArray<amrex::EBCellFlagFab> *local_278;
  MultiCutFab *local_270;
  MultiCutFab *local_268;
  FabArray<amrex::FArrayBox> *local_260;
  Geometry *local_258;
  FabArray<amrex::FArrayBox> *local_250;
  Real local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  ulong local_218;
  long local_210;
  uint32_t *local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  Array4<const_double> local_1e8;
  Array4<const_double> local_1a8;
  Array4<double> local_168;
  Array4<const_double> local_128;
  Array4<const_double> local_e8;
  MFIter local_a8;
  MFItInfo local_44;
  
  local_258 = geom;
  local_250 = &vel_eb->super_FabArray<amrex::FArrayBox>;
  EB_computeDivergence(divu,umac,geom,already_on_centroids);
  lVar10 = __dynamic_cast((divu->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                          &EBFArrayBoxFactory::typeinfo,0);
  if (lVar10 == 0) {
    __cxa_bad_cast();
  }
  pFVar11 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar10 + 0xd8));
  local_260 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar10 + 0xd8))->
               super_FabArray<amrex::FArrayBox>;
  local_268 = EBDataCollection::getBndryNormal(*(EBDataCollection **)(lVar10 + 0xd8));
  local_270 = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar10 + 0xd8));
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00753ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter(&local_a8,(FabArrayBase *)divu,&local_44);
  pFVar8 = pFVar11;
  if (local_a8.currentIndex < local_a8.endIndex) {
    do {
      local_278 = pFVar8;
      piVar12 = &local_a8.currentIndex;
      MFIter::tilebox(&local_294,&local_a8);
      if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar12 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_a8.currentIndex;
      }
      this = (pFVar11->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar12];
      FVar9 = EBCellFlagFab::getType(this,&local_294);
      if (FVar9 == singlevalued) {
        local_248 = (local_258->super_CoordSys).inv_dx[0];
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_168,&divu->super_FabArray<amrex::FArrayBox>,&local_a8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_1a8,local_250,&local_a8)
        ;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_e8,local_260,&local_a8);
        MultiCutFab::const_array(&local_1e8,local_268,&local_a8);
        pEVar6 = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
        iVar1 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
        iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
        iVar3 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        iVar4 = (this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
        iVar5 = (this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1];
        MultiCutFab::const_array(&local_128,local_270,&local_a8);
        local_230 = (long)(divu->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
        pFVar11 = local_278;
        if (0 < local_230) {
          lVar16 = (long)((iVar4 - iVar1) + 1);
          lVar17 = (long)((iVar5 - iVar2) + 1);
          local_238 = (ulong)(uint)local_294.bigend.vect[2];
          local_218 = (ulong)(uint)local_294.bigend.vect[1];
          local_240 = (long)local_294.smallend.vect[2];
          local_220 = (long)local_294.smallend.vect[1];
          local_1f0 = (long)local_294.smallend.vect[0];
          lVar18 = lVar17 * lVar16;
          local_210 = lVar18 * 4;
          local_200 = local_1f0 * 8;
          local_2a0 = 0;
          lVar10 = 0;
          do {
            local_228 = lVar10;
            puVar13 = (uint32_t *)
                      ((long)&pEVar6[local_1f0 - iVar1].flag +
                      (local_220 * 4 + (local_240 - iVar3) * lVar17 * 4 + (long)iVar2 * -4) * lVar16
                      );
            local_2d0 = local_240;
            if (local_294.smallend.vect[2] <= local_294.bigend.vect[2]) {
              do {
                local_208 = puVar13;
                puVar13 = local_208;
                lVar10 = local_220;
                if (local_294.smallend.vect[1] <= local_294.bigend.vect[1]) {
                  do {
                    if (local_294.smallend.vect[0] <= local_294.bigend.vect[0]) {
                      lVar20 = (long)local_1a8.begin.x;
                      local_1f8 = (long)local_1a8.begin.y;
                      lVar14 = (long)local_1e8.begin.x;
                      lVar7 = local_168.nstride * local_2a0 +
                              (local_2d0 - local_168.begin.z) * local_168.kstride * 8 +
                              (lVar10 - local_168.begin.y) * local_168.jstride * 8 +
                              (long)local_168.begin.x * -8 + local_200;
                      lVar23 = (local_2d0 - local_1e8.begin.z) * local_1e8.kstride;
                      lVar22 = (lVar10 - local_1e8.begin.y) * local_1e8.jstride;
                      lVar15 = (local_2d0 - local_1a8.begin.z) * local_1a8.kstride;
                      lVar19 = (lVar10 - local_1f8) * local_1a8.jstride;
                      lVar21 = 0;
                      do {
                        if ((puVar13[lVar21] & 3) == 1) {
                          *(double *)((long)local_168.p + lVar21 * 8 + lVar7) =
                               ((local_1a8.p
                                 [local_1f0 +
                                  ((lVar15 + lVar19 + local_1a8.nstride * 2 + lVar21) - lVar20)] *
                                 local_1e8.p
                                 [local_1f0 +
                                  ((lVar23 + lVar22 + local_1e8.nstride * 2 + lVar21) - lVar14)] +
                                local_1a8.p[local_1f0 + ((lVar15 + lVar19 + lVar21) - lVar20)] *
                                local_1e8.p[local_1f0 + ((lVar23 + lVar22 + lVar21) - lVar14)] +
                                local_1a8.p
                                [local_1f0 +
                                 ((local_1a8.nstride + lVar15 + lVar19 + lVar21) - lVar20)] *
                                local_1e8.p
                                [local_1f0 +
                                 ((local_1e8.nstride + lVar23 + lVar22 + lVar21) - lVar14)]) *
                                local_128.p
                                [local_1f0 +
                                 (((lVar10 - local_128.begin.y) * local_128.jstride +
                                  (local_2d0 - local_128.begin.z) * local_128.kstride + lVar21) -
                                 (long)local_128.begin.x)] * local_248) /
                               local_e8.p
                               [local_1f0 +
                                (((lVar10 - local_e8.begin.y) * local_e8.jstride +
                                 (local_2d0 - local_e8.begin.z) * local_e8.kstride + lVar21) -
                                (long)local_e8.begin.x)] +
                               *(double *)((long)local_168.p + lVar21 * 8 + lVar7);
                        }
                        lVar21 = lVar21 + 1;
                      } while ((local_294.bigend.vect[0] - local_294.smallend.vect[0]) + 1 !=
                               (int)lVar21);
                    }
                    lVar10 = lVar10 + 1;
                    puVar13 = puVar13 + lVar16;
                  } while (local_294.bigend.vect[1] + 1U != (int)lVar10);
                }
                local_2d0 = local_2d0 + 1;
                puVar13 = local_208 + lVar18;
              } while (local_294.bigend.vect[2] + 1U != (int)local_2d0);
            }
            local_2a0 = local_2a0 + 8;
            lVar10 = local_228 + 1;
          } while (local_228 + 1 != local_230);
        }
      }
      MFIter::operator++(&local_a8);
      pFVar8 = local_278;
    } while (local_a8.currentIndex < local_a8.endIndex);
  }
  MFIter::~MFIter(&local_a8);
  return;
}

Assistant:

void EB_computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                           const Geometry& geom, bool already_on_centroids,
                           const MultiFab& vel_eb)
{
    AMREX_ASSERT(divu.hasEBFabFactory());

    EB_computeDivergence(divu, umac, geom, already_on_centroids);

    // Add EB flow contribution
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(divu.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& vfrac = factory.getVolFrac();
    const auto& bnorm = factory.getBndryNormal();
    const auto& barea = factory.getBndryArea();

    MFItInfo info;
    if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(divu,info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        const auto& flagfab = flags[mfi];

        if (flagfab.getType(bx) == FabType::singlevalued) {
            const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

            Array4<Real> const& divuarr = divu.array(mfi);
            Array4<Real const> const& vel_eb_arr = vel_eb.const_array(mfi);
            Array4<Real const> const& vfracarr = vfrac.const_array(mfi);
            Array4<Real const> const& bnormarr = bnorm.const_array(mfi);
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            Array4<Real const> const& bareaarr = barea.const_array(mfi);

            AMREX_HOST_DEVICE_FOR_4D(bx,divu.nComp(),i,j,k,n,
            {
                eb_add_divergence_from_flow(i,j,k,n,divuarr,vel_eb_arr,
                    flagarr,vfracarr,bnormarr,bareaarr,dxinv);
            });
        }
    }
}